

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_ast.c
# Opt level: O0

void free_variable_decl(gvisitor_t *self,gnode_variable_decl_t *node)

{
  gnode_var_t *local_40;
  gnode_t *local_38;
  gnode_t *val;
  size_t _i;
  size_t _len;
  gnode_variable_decl_t *node_local;
  gvisitor_t *self_local;
  
  if ((node->base).refcount == 0) {
    if (node->decls != (gnode_r *)0x0) {
      if (node->decls == (gnode_r *)0x0) {
        local_38 = (gnode_t *)0x0;
      }
      else {
        local_38 = (gnode_t *)node->decls->n;
      }
      for (val = (gnode_t *)0x0; val < local_38; val = (gnode_t *)((long)&val->tag + 1)) {
        if (val < (gnode_t *)node->decls->n) {
          local_40 = (gnode_var_t *)node->decls->p[(long)val];
        }
        else {
          local_40 = (gnode_var_t *)0x0;
        }
        free_variable(self,local_40);
      }
      if (node->decls->p != (gnode_t **)0x0) {
        free(node->decls->p);
      }
      free(node->decls);
    }
    free(node);
  }
  else {
    (node->base).refcount = (node->base).refcount - 1;
  }
  return;
}

Assistant:

static void free_variable_decl (gvisitor_t *self, gnode_variable_decl_t *node) {
    CHECK_REFCOUNT(node);
    if (node->decls) {
        gnode_array_each(node->decls, {free_variable(self, (gnode_var_t *)val);});
        gnode_array_free(node->decls);
    }
    mem_free((gnode_t*)node);
}